

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

void calcBias<Blob<32>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  int *piVar4;
  int iBit;
  uint32_t bit;
  undefined3 in_register_00000081;
  int iOut;
  uint32_t bit_00;
  Blob<32> K;
  uint B;
  uint A;
  undefined4 local_64;
  undefined4 local_60;
  int local_5c;
  pfHash local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> *local_48;
  Rand *local_40;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  local_60 = CONCAT31(in_register_00000081,verbose);
  local_64 = 0;
  if (0 < reps) {
    uVar3 = 0;
    local_50 = (ulong)(uint)reps / 10;
    local_58 = hash;
    local_48 = counts;
    local_40 = r;
    do {
      if (((char)local_60 != '\0') && ((int)(uVar3 % (local_50 & 0xffffffff)) == 0)) {
        putchar(0x2e);
      }
      local_5c = (int)uVar3;
      Rand::rand_p(local_40,&local_64,4);
      bit = 0;
      (*local_58)(&local_64,4,0,local_34);
      piVar4 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_64,4,bit);
        (*local_58)(&local_64,4,0,local_38);
        flipbit(&local_64,4,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(local_34,4,bit_00);
          uVar2 = getbit(local_38,4,bit_00);
          bit_00 = bit_00 + 1;
          *piVar4 = *piVar4 + (uVar2 ^ uVar1);
          piVar4 = piVar4 + 1;
        } while (bit_00 != 0x20);
        bit = bit + 1;
      } while (bit != 0x20);
      uVar3 = (ulong)(local_5c + 1U);
    } while (local_5c + 1U != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}